

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O3

void testEncoding(void)

{
  auto_ptr<avro::OutputStream> os;
  auto_ptr<avro::InputStream> is;
  EncoderPtr e;
  ValidSchema s;
  DecoderPtr d;
  RootRecord t1;
  RootRecord t2;
  ifstream ifs;
  long *local_4d0;
  long *local_4c8;
  Encoder *local_4c0;
  shared_count local_4b8;
  ValidSchema local_4b0 [8];
  shared_count local_4a8;
  Decoder *local_4a0;
  shared_count local_498;
  RootRecord local_490;
  RootRecord local_350;
  istream local_210 [520];
  
  avro::ValidSchema::ValidSchema(local_4b0);
  std::ifstream::ifstream(local_210,"jsonschemas/bigrecord",_S_in);
  avro::compileJsonSchema(local_210,local_4b0);
  avro::memoryOutputStream((ulong)&local_4d0);
  avro::binaryEncoder();
  avro::validatingEncoder((ValidSchema *)&local_4c0,(shared_ptr *)local_4b0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_490.nestedrecord);
  (**(code **)(*(long *)local_4c0 + 0x10))(local_4c0,local_4d0);
  testgen::RootRecord::RootRecord(&local_490);
  setRecord(&local_490);
  avro::codec_traits<testgen::RootRecord>::encode(local_4c0,&local_490);
  (**(code **)(*(long *)local_4c0 + 0x18))();
  avro::binaryDecoder();
  avro::validatingDecoder((ValidSchema *)&local_4a0,(shared_ptr *)local_4b0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_350.nestedrecord);
  avro::memoryInputStream((OutputStream *)&local_4c8);
  (**(code **)(*(long *)local_4a0 + 0x10))(local_4a0,local_4c8);
  testgen::RootRecord::RootRecord(&local_350);
  avro::codec_traits<testgen::RootRecord>::decode(local_4a0,&local_350);
  checkRecord<testgen::RootRecord,testgen::RootRecord>(&local_350,&local_490);
  testgen::RootRecord::~RootRecord(&local_350);
  if (local_4c8 != (long *)0x0) {
    (**(code **)(*local_4c8 + 8))();
  }
  boost::detail::shared_count::~shared_count(&local_498);
  testgen::RootRecord::~RootRecord(&local_490);
  boost::detail::shared_count::~shared_count(&local_4b8);
  if (local_4d0 != (long *)0x0) {
    (**(code **)(*local_4d0 + 8))();
  }
  std::ifstream::~ifstream(local_210);
  boost::detail::shared_count::~shared_count(&local_4a8);
  return;
}

Assistant:

void testEncoding()
{
    ValidSchema s;
    ifstream ifs("jsonschemas/bigrecord");
    compileJsonSchema(ifs, s);
    auto_ptr<OutputStream> os = memoryOutputStream();
    EncoderPtr e = validatingEncoder(s, binaryEncoder());
    e->init(*os);
    testgen::RootRecord t1;
    setRecord(t1);
    avro::encode(*e, t1);
    e->flush();

    DecoderPtr d = validatingDecoder(s, binaryDecoder());
    auto_ptr<InputStream> is = memoryInputStream(*os);
    d->init(*is);
    testgen::RootRecord t2;
    avro::decode(*d, t2);

    checkRecord(t2, t1);
}